

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfnt.cpp
# Opt level: O0

bool dpfb::checkOffsetTableSignature(uint32_t signature)

{
  uint32_t sign;
  uint32_t *__end1;
  uint32_t *__begin1;
  uint32_t (*__range1) [5];
  uint32_t signature_local;
  
  __end1 = checkOffsetTableSignature::signatures;
  while( true ) {
    if (__end1 == (uint32_t *)"data is nullptr") {
      return false;
    }
    if (signature == *__end1) break;
    __end1 = __end1 + 1;
  }
  return true;
}

Assistant:

static bool checkOffsetTableSignature(std::uint32_t signature)
{
    static const std::uint32_t signatures[] = {
        0x00010000,
        0x00020000,
        sfntTag('t', 'r', 'u', 'e'),
        sfntTag('t', 'y', 'p', '1'),
        sfntTag('O', 'T', 'T', 'O'),
    };

    for (auto sign : signatures)
        if (signature == sign)
            return true;

    return false;
}